

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BiDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_bidirectionallstm
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x1ae) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x1ae;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.bidirectionallstm_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::BiDirectionalLSTMLayerParams>(arena);
    (this->layer_).bidirectionallstm_ = (BiDirectionalLSTMLayerParams *)LVar2;
  }
  return (BiDirectionalLSTMLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::BiDirectionalLSTMLayerParams* NeuralNetworkLayer::_internal_mutable_bidirectionallstm() {
  if (!_internal_has_bidirectionallstm()) {
    clear_layer();
    set_has_bidirectionallstm();
    layer_.bidirectionallstm_ = CreateMaybeMessage< ::CoreML::Specification::BiDirectionalLSTMLayerParams >(GetArenaForAllocation());
  }
  return layer_.bidirectionallstm_;
}